

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  uint uVar2;
  size_t sVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  size_t bits;
  AccelData *pAVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar12;
  undefined4 uVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  RTCFilterFunctionN p_Var16;
  RTCFilterFunctionN p_Var17;
  NodeRef nodeRef;
  RTCFilterFunctionN p_Var18;
  RTCFilterFunctionN p_Var19;
  NodeRef *pNVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  vint4 ai_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar31;
  vint4 ai;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar35;
  vint4 ai_1;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 ai_3;
  undefined1 auVar39 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi;
  undefined1 auVar40 [16];
  vint4 bi_1;
  undefined1 auVar41 [16];
  vint4 bi_3;
  undefined1 auVar42 [16];
  vint4 bi_2;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  vint4 bi_8;
  undefined1 local_17c8 [16];
  RTCIntersectFunctionNArguments local_17b0;
  Geometry *local_1780;
  undefined8 local_1778;
  RTCIntersectArguments *local_1770;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1748;
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  pAVar9 = This->ptr;
  p_Var18 = *(RTCFilterFunctionN *)&pAVar9[1].bounds.bounds0.lower.field_0;
  if (p_Var18 != (RTCFilterFunctionN)0x8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pAVar9 = (AccelData *)context->args,
       ((ulong)(pAVar9->super_RefCount)._vptr_RefCount & 0x10000) != 0)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar49 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar25 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar49);
    iVar8 = vmovmskps_avx(auVar25);
    uVar10 = CONCAT44((int)((ulong)pAVar9 >> 0x20),iVar8);
    if (iVar8 != 0) {
      auVar33 = *(undefined1 (*) [16])(ray + 0x40);
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx(auVar33,auVar24);
      auVar36._8_4_ = 0x219392ef;
      auVar36._0_8_ = 0x219392ef219392ef;
      auVar36._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar36,1);
      auVar27 = vblendvps_avx(auVar33,auVar36,auVar26);
      auVar26 = *(undefined1 (*) [16])(ray + 0x50);
      auVar44 = vandps_avx(auVar26,auVar24);
      auVar44 = vcmpps_avx(auVar44,auVar36,1);
      auVar28 = vblendvps_avx(auVar26,auVar36,auVar44);
      auVar44 = *(undefined1 (*) [16])(ray + 0x60);
      auVar24 = vandps_avx(auVar44,auVar24);
      auVar24 = vcmpps_avx(auVar24,auVar36,1);
      auVar24 = vblendvps_avx(auVar44,auVar36,auVar24);
      auVar36 = vrcpps_avx(auVar27);
      fVar45 = auVar36._0_4_;
      auVar32._0_4_ = auVar27._0_4_ * fVar45;
      fVar46 = auVar36._4_4_;
      auVar32._4_4_ = auVar27._4_4_ * fVar46;
      fVar47 = auVar36._8_4_;
      auVar32._8_4_ = auVar27._8_4_ * fVar47;
      fVar48 = auVar36._12_4_;
      auVar32._12_4_ = auVar27._12_4_ * fVar48;
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      auVar36 = vsubps_avx(auVar51,auVar32);
      auVar27 = vrcpps_avx(auVar28);
      fVar56 = auVar27._0_4_;
      auVar37._0_4_ = auVar28._0_4_ * fVar56;
      fVar57 = auVar27._4_4_;
      auVar37._4_4_ = auVar28._4_4_ * fVar57;
      fVar58 = auVar27._8_4_;
      auVar37._8_4_ = auVar28._8_4_ * fVar58;
      fVar59 = auVar27._12_4_;
      auVar37._12_4_ = auVar28._12_4_ * fVar59;
      auVar28 = vsubps_avx(auVar51,auVar37);
      auVar27 = vrcpps_avx(auVar24);
      fVar4 = auVar27._0_4_;
      auVar43._0_4_ = auVar24._0_4_ * fVar4;
      fVar5 = auVar27._4_4_;
      auVar43._4_4_ = auVar24._4_4_ * fVar5;
      fVar6 = auVar27._8_4_;
      auVar43._8_4_ = auVar24._8_4_ * fVar6;
      fVar7 = auVar27._12_4_;
      auVar43._12_4_ = auVar24._12_4_ * fVar7;
      auVar24 = vsubps_avx(auVar51,auVar43);
      auVar27 = ZEXT416(0) << 0x20;
      auVar33 = vcmpps_avx(auVar33,auVar27,1);
      auVar52._8_4_ = 1;
      auVar52._0_8_ = 0x100000001;
      auVar52._12_4_ = 1;
      auVar33 = vandps_avx(auVar52,auVar33);
      auVar26 = vcmpps_avx(auVar26,auVar27,1);
      auVar53._8_4_ = 2;
      auVar53._0_8_ = 0x200000002;
      auVar53._12_4_ = 2;
      auVar26 = vandps_avx(auVar53,auVar26);
      auVar26 = vorps_avx(auVar26,auVar33);
      auVar54 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar33 = vcmpps_avx(auVar44,auVar27,1);
      auVar44._8_4_ = 4;
      auVar44._0_8_ = 0x400000004;
      auVar44._12_4_ = 4;
      auVar33 = vandps_avx(auVar44,auVar33);
      auVar60 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar61 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar49 = vpor_avx(auVar25 ^ auVar49,auVar33);
      local_17c8 = vpor_avx(auVar49,auVar26);
      do {
        lVar14 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar13 = *(undefined4 *)(local_17c8 + lVar14 * 4);
        auVar49._4_4_ = uVar13;
        auVar49._0_4_ = uVar13;
        auVar49._8_4_ = uVar13;
        auVar49._12_4_ = uVar13;
        auVar49 = vpcmpeqd_avx(auVar49,local_17c8);
        uVar13 = vmovmskps_avx(auVar49);
        uVar10 = uVar10 & ~CONCAT44((int)((ulong)lVar14 >> 0x20),uVar13);
      } while (uVar10 != 0);
      local_17c8 = vpcmpeqd_avx(local_17c8,local_17c8);
      auVar25 = vpcmpeqd_avx(local_17c8,(undefined1  [16])valid_i->field_0);
      auVar49 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar50 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      stack_near[1].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar49,auVar25);
      auVar55 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = (size_t)p_Var18;
      if (p_Var18 != (RTCFilterFunctionN)&DAT_fffffffffffffff8) {
        fVar45 = fVar45 + auVar36._0_4_ * fVar45;
        fVar46 = fVar46 + auVar36._4_4_ * fVar46;
        fVar47 = fVar47 + auVar36._8_4_ * fVar47;
        fVar48 = fVar48 + auVar36._12_4_ * fVar48;
        fVar56 = fVar56 + auVar28._0_4_ * fVar56;
        fVar57 = fVar57 + auVar28._4_4_ * fVar57;
        fVar58 = fVar58 + auVar28._8_4_ * fVar58;
        fVar59 = fVar59 + auVar28._12_4_ * fVar59;
        local_16f8 = fVar4 + auVar24._0_4_ * fVar4;
        fStack_16f4 = fVar5 + auVar24._4_4_ * fVar5;
        fStack_16f0 = fVar6 + auVar24._8_4_ * fVar6;
        fStack_16ec = fVar7 + auVar24._12_4_ * fVar7;
        pNVar20 = stack_node + 1;
        auVar49 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa10);
        auVar33._8_4_ = 0xff800000;
        auVar33._0_8_ = 0xff800000ff800000;
        auVar33._12_4_ = 0xff800000;
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       vblendvps_avx(auVar33,auVar49,auVar25);
        paVar12 = &stack_near[2].field_0;
        local_1718 = *(undefined1 (*) [16])ray;
        local_1728 = *(undefined1 (*) [16])(ray + 0x10);
        local_1738 = *(undefined1 (*) [16])(ray + 0x20);
        local_1748 = stack_near[1].field_0;
        local_1758 = fVar45;
        fStack_1754 = fVar46;
        fStack_1750 = fVar47;
        fStack_174c = fVar48;
        local_1768 = fVar56;
        fStack_1764 = fVar57;
        fStack_1760 = fVar58;
        fStack_175c = fVar59;
        do {
          paVar1 = paVar12 + -1;
          auVar23 = ZEXT1664((undefined1  [16])*paVar1);
          paVar12 = paVar12 + -1;
          auVar49 = vcmpps_avx((undefined1  [16])*paVar1,(undefined1  [16])bi_8.field_0,1);
          if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar49[0xf] < '\0') {
            while (((ulong)p_Var18 & 8) == 0) {
              lVar14 = 0;
              uVar10 = 0;
              auVar23 = ZEXT1664(auVar50._0_16_);
              p_Var19 = (RTCFilterFunctionN)0x8;
              do {
                p_Var16 = *(RTCFilterFunctionN *)
                           (((ulong)p_Var18 & 0xfffffffffffffff0) + lVar14 * 8);
                if (p_Var16 == (RTCFilterFunctionN)0x8) break;
                uVar13 = *(undefined4 *)(p_Var18 + lVar14 * 4 + 0x20);
                auVar25._4_4_ = uVar13;
                auVar25._0_4_ = uVar13;
                auVar25._8_4_ = uVar13;
                auVar25._12_4_ = uVar13;
                auVar49 = vsubps_avx(auVar25,auVar54._0_16_);
                auVar34._0_4_ = fVar45 * auVar49._0_4_;
                auVar34._4_4_ = fVar46 * auVar49._4_4_;
                auVar34._8_4_ = fVar47 * auVar49._8_4_;
                auVar34._12_4_ = fVar48 * auVar49._12_4_;
                uVar13 = *(undefined4 *)(p_Var18 + lVar14 * 4 + 0x40);
                auVar26._4_4_ = uVar13;
                auVar26._0_4_ = uVar13;
                auVar26._8_4_ = uVar13;
                auVar26._12_4_ = uVar13;
                auVar49 = vsubps_avx(auVar26,auVar60._0_16_);
                auVar38._0_4_ = fVar56 * auVar49._0_4_;
                auVar38._4_4_ = fVar57 * auVar49._4_4_;
                auVar38._8_4_ = fVar58 * auVar49._8_4_;
                auVar38._12_4_ = fVar59 * auVar49._12_4_;
                uVar13 = *(undefined4 *)(p_Var18 + lVar14 * 4 + 0x60);
                auVar27._4_4_ = uVar13;
                auVar27._0_4_ = uVar13;
                auVar27._8_4_ = uVar13;
                auVar27._12_4_ = uVar13;
                auVar49 = vsubps_avx(auVar27,auVar61._0_16_);
                auVar39._0_4_ = local_16f8 * auVar49._0_4_;
                auVar39._4_4_ = fStack_16f4 * auVar49._4_4_;
                auVar39._8_4_ = fStack_16f0 * auVar49._8_4_;
                auVar39._12_4_ = fStack_16ec * auVar49._12_4_;
                uVar13 = *(undefined4 *)(p_Var18 + lVar14 * 4 + 0x30);
                auVar28._4_4_ = uVar13;
                auVar28._0_4_ = uVar13;
                auVar28._8_4_ = uVar13;
                auVar28._12_4_ = uVar13;
                auVar49 = vsubps_avx(auVar28,auVar54._0_16_);
                auVar40._0_4_ = fVar45 * auVar49._0_4_;
                auVar40._4_4_ = fVar46 * auVar49._4_4_;
                auVar40._8_4_ = fVar47 * auVar49._8_4_;
                auVar40._12_4_ = fVar48 * auVar49._12_4_;
                uVar13 = *(undefined4 *)(p_Var18 + lVar14 * 4 + 0x50);
                auVar29._4_4_ = uVar13;
                auVar29._0_4_ = uVar13;
                auVar29._8_4_ = uVar13;
                auVar29._12_4_ = uVar13;
                auVar49 = vsubps_avx(auVar29,auVar60._0_16_);
                auVar41._0_4_ = fVar56 * auVar49._0_4_;
                auVar41._4_4_ = fVar57 * auVar49._4_4_;
                auVar41._8_4_ = fVar58 * auVar49._8_4_;
                auVar41._12_4_ = fVar59 * auVar49._12_4_;
                uVar13 = *(undefined4 *)(p_Var18 + lVar14 * 4 + 0x70);
                auVar30._4_4_ = uVar13;
                auVar30._0_4_ = uVar13;
                auVar30._8_4_ = uVar13;
                auVar30._12_4_ = uVar13;
                auVar49 = vsubps_avx(auVar30,auVar61._0_16_);
                auVar42._0_4_ = local_16f8 * auVar49._0_4_;
                auVar42._4_4_ = fStack_16f4 * auVar49._4_4_;
                auVar42._8_4_ = fStack_16f0 * auVar49._8_4_;
                auVar42._12_4_ = fStack_16ec * auVar49._12_4_;
                auVar49 = vpminsd_avx(auVar34,auVar40);
                auVar25 = vpminsd_avx(auVar38,auVar41);
                auVar49 = vpmaxsd_avx(auVar49,auVar25);
                auVar25 = vpminsd_avx(auVar39,auVar42);
                auVar25 = vpmaxsd_avx(auVar49,auVar25);
                auVar49 = vpmaxsd_avx(auVar34,auVar40);
                auVar33 = vpmaxsd_avx(auVar38,auVar41);
                auVar26 = vpminsd_avx(auVar49,auVar33);
                auVar49 = vpmaxsd_avx(auVar39,auVar42);
                auVar33 = vpmaxsd_avx(auVar25,auVar55._0_16_);
                auVar49 = vpminsd_avx(auVar49,(undefined1  [16])bi_8.field_0);
                auVar49 = vpminsd_avx(auVar26,auVar49);
                auVar49 = vcmpps_avx(auVar33,auVar49,2);
                if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar49[0xf] < '\0') {
                  aVar35 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vblendvps_avx(auVar50._0_16_,auVar25,auVar49);
                  aVar21 = auVar23._0_16_;
                  auVar49 = vcmpps_avx((undefined1  [16])aVar35,(undefined1  [16])aVar21,1);
                  p_Var15 = p_Var19;
                  p_Var17 = p_Var16;
                  aVar31 = aVar35;
                  if (((((auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar49[0xf]) ||
                     (p_Var15 = p_Var16, p_Var17 = p_Var19, aVar31 = aVar21, aVar21 = aVar35,
                     p_Var19 != (RTCFilterFunctionN)0x8)) {
                    aVar35 = aVar21;
                    uVar10 = uVar10 + 1;
                    pNVar20->ptr = (size_t)p_Var17;
                    pNVar20 = pNVar20 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar12->v = aVar31;
                    paVar12 = paVar12 + 1;
                    p_Var16 = p_Var15;
                  }
                  auVar23 = ZEXT1664((undefined1  [16])aVar35);
                  p_Var19 = p_Var16;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 4);
              if (p_Var19 == (RTCFilterFunctionN)0x8) goto LAB_00305deb;
              p_Var18 = p_Var19;
              if (1 < uVar10) {
                aVar35 = paVar12[-2];
                aVar31 = paVar12[-1];
                auVar49 = vcmpps_avx((undefined1  [16])aVar35,(undefined1  [16])aVar31,1);
                aVar21 = aVar31;
                if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar49[0xf] < '\0') {
                  paVar12[-2] = aVar31;
                  paVar12[-1] = aVar35;
                  auVar49 = vpermilps_avx(*(undefined1 (*) [16])(pNVar20 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar20 + -2) = auVar49;
                  aVar21 = aVar35;
                  aVar35 = aVar31;
                }
                if (uVar10 != 2) {
                  aVar31 = paVar12[-3];
                  auVar49 = vcmpps_avx((undefined1  [16])aVar31,(undefined1  [16])aVar21,1);
                  if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar49[0xf] < '\0') {
                    paVar12[-3] = aVar21;
                    paVar12[-1] = aVar31;
                    sVar3 = pNVar20[-3].ptr;
                    pNVar20[-3].ptr = pNVar20[-1].ptr;
                    pNVar20[-1].ptr = sVar3;
                    aVar31 = aVar21;
                  }
                  auVar49 = vcmpps_avx((undefined1  [16])aVar31,(undefined1  [16])aVar35,1);
                  if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar49[0xf] < '\0') {
                    paVar12[-3] = aVar35;
                    paVar12[-2] = aVar31;
                    auVar49 = vpermilps_avx(*(undefined1 (*) [16])(pNVar20 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar20 + -3) = auVar49;
                  }
                }
              }
            }
            if (p_Var18 == (RTCFilterFunctionN)&DAT_fffffffffffffff8) {
              return;
            }
            auVar49 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar23._0_16_,6);
            auVar23 = ZEXT1664(auVar49);
            if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar49[0xf] < '\0') {
              uVar10 = (ulong)((uint)p_Var18 & 0xf);
              if (uVar10 != 8) {
                lVar14 = 0;
                local_1708 = auVar49;
                do {
                  local_17b0.geomID = *(uint *)(((ulong)p_Var18 & 0xfffffffffffffff0) + lVar14 * 8);
                  local_1780 = (context->scene->geometries).items[local_17b0.geomID].ptr;
                  uVar2 = local_1780->mask;
                  auVar22._4_4_ = uVar2;
                  auVar22._0_4_ = uVar2;
                  auVar22._8_4_ = uVar2;
                  auVar22._12_4_ = uVar2;
                  auVar49 = vandps_avx(auVar22,*(undefined1 (*) [16])(ray + 0x90));
                  auVar49 = vpcmpeqd_avx(auVar49,_DAT_01f7aa10);
                  auVar25 = auVar23._0_16_ & ~auVar49;
                  if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar25[0xf] < '\0') {
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vandnps_avx(auVar49,auVar23._0_16_);
                    local_17b0.primID =
                         *(uint *)(((ulong)p_Var18 & 0xfffffffffffffff0) + 4 + lVar14 * 8);
                    local_17b0.valid = (int *)&mask;
                    local_17b0.geometryUserPtr = local_1780->userPtr;
                    local_17b0.context = context->user;
                    local_17b0.N = 4;
                    local_1778 = 0;
                    local_1770 = context->args;
                    pp_Var11 = (_func_int **)local_1770->intersect;
                    if (pp_Var11 == (_func_int **)0x0) {
                      pp_Var11 = local_1780[1].super_RefCount._vptr_RefCount;
                    }
                    local_17b0.rayhit = (RTCRayHitN *)ray;
                    (*(code *)pp_Var11)(&local_17b0);
                    auVar54 = ZEXT1664(local_1718);
                    auVar60 = ZEXT1664(local_1728);
                    auVar61 = ZEXT1664(local_1738);
                    auVar50 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar55 = ZEXT1664((undefined1  [16])local_1748);
                    auVar23 = ZEXT1664(local_1708);
                    fVar45 = local_1758;
                    fVar46 = fStack_1754;
                    fVar47 = fStack_1750;
                    fVar48 = fStack_174c;
                    fVar56 = local_1768;
                    fVar57 = fStack_1764;
                    fVar58 = fStack_1760;
                    fVar59 = fStack_175c;
                  }
                  auVar49 = auVar23._0_16_;
                  lVar14 = lVar14 + 1;
                } while (uVar10 - 8 != lVar14);
              }
              bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                             vblendvps_avx((undefined1  [16])bi_8.field_0,
                                           *(undefined1 (*) [16])(ray + 0x80),auVar49);
            }
          }
LAB_00305deb:
          p_Var18 = (RTCFilterFunctionN)pNVar20[-1].ptr;
          pNVar20 = pNVar20 + -1;
        } while (p_Var18 != (RTCFilterFunctionN)&DAT_fffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }